

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.cpp
# Opt level: O1

int pk_parse_key_pkcs8_unencrypted_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  mbedtls_pk_type_t mVar2;
  mbedtls_pk_info_t *info;
  mbedtls_rsa_context *rsa;
  uchar *end;
  mbedtls_pk_type_t pk_alg;
  uchar *p;
  size_t len;
  int version;
  mbedtls_asn1_buf params;
  mbedtls_pk_type_t local_64;
  uchar *local_60;
  size_t local_58;
  int local_4c;
  mbedtls_pk_context local_48;
  mbedtls_asn1_buf local_38;
  
  local_64 = MBEDTLS_PK_NONE;
  local_60 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_60,key + keylen,&local_58,0x30);
  if (iVar1 == 0) {
    end = local_60 + local_58;
    iVar1 = mbedtls_asn1_get_int(&local_60,end,&local_4c);
    if (iVar1 == 0) {
      if (local_4c != 0) {
        return -0x3d80;
      }
      iVar1 = pk_get_pk_alg(&local_60,end,&local_64,&local_38,p_rng);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = mbedtls_asn1_get_tag(&local_60,end,&local_58,4);
      if (iVar1 == 0) {
        if (local_58 == 0) {
          return -0x3d60;
        }
        info = mbedtls_pk_info_from_type(local_64);
        if (info == (mbedtls_pk_info_t *)0x0) {
          return -0x3c80;
        }
        iVar1 = mbedtls_pk_setup(pk,info);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (local_64 != MBEDTLS_PK_RSA) {
          return -0x3c80;
        }
        local_48.pk_info = pk->pk_info;
        local_48.pk_ctx = pk->pk_ctx;
        mVar2 = mbedtls_pk_get_type(&local_48);
        rsa = (mbedtls_rsa_context *)local_48.pk_ctx;
        if (mVar2 != MBEDTLS_PK_RSA) {
          rsa = (mbedtls_rsa_context *)0x0;
        }
        iVar1 = mbedtls_rsa_parse_key(rsa,local_60,local_58);
        if (iVar1 != 0) {
          mbedtls_pk_free(pk);
          return iVar1;
        }
        if (local_60 + local_58 != key + keylen) {
          return -0x3d66;
        }
        return 0;
      }
    }
  }
  return iVar1 + -0x3d00;
}

Assistant:

static int pk_parse_key_pkcs8_unencrypted_der(
    mbedtls_pk_context *pk,
    const unsigned char *key, size_t keylen,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret, version;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    int ec_grp_id = 0;
    const mbedtls_pk_info_t *pk_info;

#if !defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    (void) f_rng;
    (void) p_rng;
#endif

    /*
     * This function parses the PrivateKeyInfo object (PKCS#8 v1.2 = RFC 5208)
     *
     *    PrivateKeyInfo ::= SEQUENCE {
     *      version                   Version,
     *      privateKeyAlgorithm       PrivateKeyAlgorithmIdentifier,
     *      privateKey                PrivateKey,
     *      attributes           [0]  IMPLICIT Attributes OPTIONAL }
     *
     *    Version ::= INTEGER
     *    PrivateKeyAlgorithmIdentifier ::= AlgorithmIdentifier
     *    PrivateKey ::= OCTET STRING
     *
     *  The PrivateKey OCTET STRING is a SEC1 ECPrivateKey
     */

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = p + len;

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (version != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_VERSION, ret);
    }

    if ((ret = pk_get_pk_alg(&p, end, &pk_alg, &params, &ec_grp_id)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (len < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    if ((pk_info = mbedtls_pk_info_from_type(pk_alg)) == NULL) {
        return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;
    }

    if ((ret = mbedtls_pk_setup(pk, pk_info)) != 0) {
        return ret;
    }

#if defined(MBEDTLS_RSA_C)
    if (pk_alg == MBEDTLS_PK_RSA) {
        if ((ret = mbedtls_rsa_parse_key(mbedtls_pk_rsa(*pk), p, len)) != 0) {
            mbedtls_pk_free(pk);
            return ret;
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_PK_HAVE_ECC_KEYS)
    if (pk_alg == MBEDTLS_PK_ECKEY || pk_alg == MBEDTLS_PK_ECKEY_DH) {
#if defined(MBEDTLS_PK_HAVE_RFC8410_CURVES)
        if (MBEDTLS_PK_IS_RFC8410_GROUP_ID(ec_grp_id)) {
            if ((ret =
                     pk_use_ecparams_rfc8410(&params, ec_grp_id, pk)) != 0 ||
                (ret =
                     pk_parse_key_rfc8410_der(pk, p, len, end, f_rng,
                                              p_rng)) != 0) {
                mbedtls_pk_free(pk);
                return ret;
            }
        } else
#endif
        {
            if ((ret = pk_use_ecparams(&params, pk)) != 0 ||
                (ret = pk_parse_key_sec1_der(pk, p, len, f_rng, p_rng)) != 0) {
                mbedtls_pk_free(pk);
                return ret;
            }
        }
    } else
#endif /* MBEDTLS_PK_HAVE_ECC_KEYS */
    return MBEDTLS_ERR_PK_UNKNOWN_PK_ALG;

    end = p + len;
    if (end != (key + keylen)) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}